

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

TypeNames * __thiscall
wasm::PrintSExpression::TypePrinter::getNames
          (TypeNames *__return_storage_ptr__,TypePrinter *this,HeapType type)

{
  Module *pMVar1;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true> _Var2;
  key_type local_20;
  HeapType type_local;
  
  pMVar1 = this->parent->currModule;
  local_20.id = type.id;
  if ((pMVar1 == (Module *)0x0) ||
     ((_Var2._M_cur = (__node_type *)
                      std::
                      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find(&(pMVar1->typeNames)._M_h,&local_20),
      _Var2._M_cur == (__node_type *)0x0 &&
      (_Var2._M_cur = (__node_type *)
                      std::
                      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find(&(this->fallbackNames)._M_h,&local_20),
      _Var2._M_cur == (__node_type *)0x0)))) {
    DefaultTypeNameGenerator::getNames(__return_storage_ptr__,&this->fallback,(HeapType)local_20.id)
    ;
  }
  else {
    TypeNames::TypeNames
              (__return_storage_ptr__,
               (TypeNames *)
               ((long)&((_Var2._M_cur)->
                       super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>
                       ._M_storage._M_storage + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

TypeNames getNames(HeapType type) {
      if (parent.currModule) {
        if (auto it = parent.currModule->typeNames.find(type);
            it != parent.currModule->typeNames.end()) {
          return it->second;
        }
        // In principle we should always have at least a fallback name for every
        // type in the module, so this lookup should never fail. In practice,
        // though, the `printExpression` variants deliberately avoid walking the
        // module to find unnamed types so they can be safely used in a
        // function-parallel context. That means we can have a module but not
        // have generated the fallback names, so this lookup can fail, in which
        // case we generate a name on demand.
        if (auto it = fallbackNames.find(type); it != fallbackNames.end()) {
          return it->second;
        }
      }
      return fallback.getNames(type);
    }